

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

void __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
::
Cloner<robin_hood::detail::Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>,_false>
::operator()(Cloner<robin_hood::detail::Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>,_false>
             *this,Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
                   *s,
            Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
            *t)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Node *pNVar3;
  Node *pNVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  size_t i;
  ulong uVar10;
  long lVar11;
  size_t __n;
  ulong uVar12;
  
  uVar10 = t->mMask + 1;
  if (uVar10 < 0x28f5c28f5c28f5d) {
    uVar8 = (uVar10 * 0x50) / 100;
  }
  else {
    uVar8 = (uVar10 / 100) * 0x50;
  }
  uVar12 = 0xff;
  if (uVar8 < 0xff) {
    uVar12 = uVar8;
  }
  __n = uVar12 + uVar10 + 8;
  if (__n != 0) {
    memmove(t->mInfo,s->mInfo,__n);
  }
  lVar9 = 0;
  for (lVar11 = 0; uVar12 + uVar10 != lVar11; lVar11 = lVar11 + 1) {
    if (t->mInfo[lVar11] != '\0') {
      pNVar3 = t->mKeyVals;
      pNVar4 = s->mKeyVals;
      *(undefined8 *)((long)&(pNVar3->mData).second.texcoords[1].y + lVar9) =
           *(undefined8 *)((long)&(pNVar4->mData).second.texcoords[1].y + lVar9);
      puVar1 = (undefined8 *)((long)(pNVar4->mData).second.texcoords + lVar9 + -0x14);
      uVar5 = *puVar1;
      uVar6 = puVar1[1];
      puVar1 = (undefined8 *)((long)(pNVar4->mData).second.texcoords + lVar9 + -4);
      uVar7 = puVar1[1];
      puVar2 = (undefined8 *)((long)(pNVar3->mData).second.texcoords + lVar9 + -4);
      *puVar2 = *puVar1;
      puVar2[1] = uVar7;
      puVar1 = (undefined8 *)((long)(pNVar3->mData).second.texcoords + lVar9 + -0x14);
      *puVar1 = uVar5;
      puVar1[1] = uVar6;
    }
    lVar9 = lVar9 + 0x28;
  }
  return;
}

Assistant:

void operator()(M const& s, M& t) const {
            auto const numElementsWithBuffer = t.calcNumElementsWithBuffer(t.mMask + 1);
            std::copy(s.mInfo, s.mInfo + t.calcNumBytesInfo(numElementsWithBuffer), t.mInfo);

            for (size_t i = 0; i < numElementsWithBuffer; ++i) {
                if (t.mInfo[i]) {
                    ::new (static_cast<void*>(t.mKeyVals + i)) Node(t, *s.mKeyVals[i]);
                }
            }
        }